

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlMultMatrixf(float *matf)

{
  Matrix right;
  Matrix *pMVar1;
  Matrix mat;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  pMVar1 = RLGL.State.currentMatrix;
  right.m4 = matf[4];
  right.m0 = *matf;
  right.m12 = matf[0xc];
  right.m8 = matf[8];
  right.m5 = matf[5];
  right.m1 = matf[1];
  right.m13 = matf[0xd];
  right.m9 = matf[9];
  right.m6 = matf[6];
  right.m2 = matf[2];
  right.m14 = matf[0xe];
  right.m10 = matf[10];
  right.m7 = matf[7];
  right.m3 = matf[3];
  right.m15 = matf[0xf];
  right.m11 = matf[0xb];
  MatrixMultiply(*RLGL.State.currentMatrix,right);
  pMVar1->m3 = (float)(undefined4)local_20;
  pMVar1->m7 = (float)local_20._4_4_;
  pMVar1->m11 = (float)(undefined4)uStack_18;
  pMVar1->m15 = (float)uStack_18._4_4_;
  pMVar1->m2 = (float)(undefined4)local_30;
  pMVar1->m6 = (float)local_30._4_4_;
  pMVar1->m10 = (float)(undefined4)uStack_28;
  pMVar1->m14 = (float)uStack_28._4_4_;
  pMVar1->m1 = (float)(undefined4)local_40;
  pMVar1->m5 = (float)local_40._4_4_;
  pMVar1->m9 = (float)(undefined4)uStack_38;
  pMVar1->m13 = (float)uStack_38._4_4_;
  pMVar1->m0 = (float)(undefined4)local_50;
  pMVar1->m4 = (float)local_50._4_4_;
  pMVar1->m8 = (float)(undefined4)uStack_48;
  pMVar1->m12 = (float)uStack_48._4_4_;
  return;
}

Assistant:

void rlMultMatrixf(float *matf)
{
    // Matrix creation from array
    Matrix mat = { matf[0], matf[4], matf[8], matf[12],
                   matf[1], matf[5], matf[9], matf[13],
                   matf[2], matf[6], matf[10], matf[14],
                   matf[3], matf[7], matf[11], matf[15] };

    *RLGL.State.currentMatrix = MatrixMultiply(*RLGL.State.currentMatrix, mat);
}